

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_vfs_or_default_seek
                    (ma_vfs *pVFS,ma_vfs_file file,ma_int64 offset,ma_seek_origin origin)

{
  int iVar1;
  ma_result mVar2;
  
  if (pVFS == (ma_vfs *)0x0) {
    if (file != (ma_vfs_file)0x0) {
      iVar1 = (origin == ma_seek_origin_end) + 1;
      if (origin == ma_seek_origin_start) {
        iVar1 = 0;
      }
      iVar1 = fseek((FILE *)file,offset,iVar1);
      return -(uint)(iVar1 != 0);
    }
    return MA_INVALID_ARGS;
  }
  if (file == (ma_vfs_file)0x0) {
    mVar2 = MA_INVALID_ARGS;
  }
  else {
    if (*(code **)((long)pVFS + 0x28) != (code *)0x0) {
      mVar2 = (**(code **)((long)pVFS + 0x28))();
      return mVar2;
    }
    mVar2 = MA_NOT_IMPLEMENTED;
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_vfs_or_default_seek(ma_vfs* pVFS, ma_vfs_file file, ma_int64 offset, ma_seek_origin origin)
{
    if (pVFS != NULL) {
        return ma_vfs_seek(pVFS, file, offset, origin);
    } else {
        return ma_default_vfs_seek(pVFS, file, offset, origin);
    }
}